

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<char_const(&)[9],unsigned_int&,char_const(&)[5],unsigned_int&,char_const(&)[9]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [9],uint *ts_1,
          char (*ts_2) [5],uint *ts_3,char (*ts_4) [9])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::join_helper<char_const(&)[9],unsigned_int&,char_const(&)[5],unsigned_int&,char_const(&)[9]>
            (&local_1120,(char (*) [9])this,(uint *)ts,(char (*) [5])ts_1,(uint *)ts_2,
             (char (*) [9])ts_3);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}